

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBvhTriangleMeshShape.cpp
# Opt level: O2

void __thiscall
cbtBvhTriangleMeshShape::processAllTriangles
          (cbtBvhTriangleMeshShape *this,cbtTriangleCallback *callback,cbtVector3 *aabbMin,
          cbtVector3 *aabbMax)

{
  MyNodeOverlapCallback myNodeCallback;
  cbtNodeOverlapCallback local_50;
  cbtStridingMeshInterface *local_48;
  cbtTriangleCallback *local_40;
  undefined4 local_8;
  
  local_48 = (this->super_cbtTriangleMeshShape).m_meshInterface;
  local_50._vptr_cbtNodeOverlapCallback = (_func_int **)&PTR__cbtNodeOverlapCallback_011956b0;
  local_8 = 0;
  local_40 = callback;
  cbtQuantizedBvh::reportAabbOverlappingNodex
            (&this->m_bvh->super_cbtQuantizedBvh,&local_50,aabbMin,aabbMax);
  return;
}

Assistant:

void cbtBvhTriangleMeshShape::processAllTriangles(cbtTriangleCallback* callback, const cbtVector3& aabbMin, const cbtVector3& aabbMax) const
{
#ifdef DISABLE_BVH
	//brute force traverse all triangles
	cbtTriangleMeshShape::processAllTriangles(callback, aabbMin, aabbMax);
#else

	//first get all the nodes

	struct MyNodeOverlapCallback : public cbtNodeOverlapCallback
	{
		cbtStridingMeshInterface* m_meshInterface;
		cbtTriangleCallback* m_callback;
		cbtVector3 m_triangle[3];
		int m_numOverlap;

		MyNodeOverlapCallback(cbtTriangleCallback* callback, cbtStridingMeshInterface* meshInterface)
			: m_meshInterface(meshInterface),
			  m_callback(callback),
			  m_numOverlap(0)
		{
		}

		virtual void processNode(int nodeSubPart, int nodeTriangleIndex)
		{
			m_numOverlap++;
			const unsigned char* vertexbase;
			int numverts;
			PHY_ScalarType type;
			int stride;
			const unsigned char* indexbase;
			int indexstride;
			int numfaces;
			PHY_ScalarType indicestype;

			m_meshInterface->getLockedReadOnlyVertexIndexBase(
				&vertexbase,
				numverts,
				type,
				stride,
				&indexbase,
				indexstride,
				numfaces,
				indicestype,
				nodeSubPart);

			unsigned int* gfxbase = (unsigned int*)(indexbase + nodeTriangleIndex * indexstride);
			cbtAssert(indicestype == PHY_INTEGER || indicestype == PHY_SHORT || indicestype == PHY_UCHAR);

			const cbtVector3& meshScaling = m_meshInterface->getScaling();
			for (int j = 2; j >= 0; j--)
			{
				int graphicsindex = indicestype == PHY_SHORT ? ((unsigned short*)gfxbase)[j] : indicestype == PHY_INTEGER ? gfxbase[j] : ((unsigned char*)gfxbase)[j];

#ifdef DEBUG_TRIANGLE_MESH
				printf("%d ,", graphicsindex);
#endif  //DEBUG_TRIANGLE_MESH
				if (type == PHY_FLOAT)
				{
					float* graphicsbase = (float*)(vertexbase + graphicsindex * stride);

					m_triangle[j] = cbtVector3(
						graphicsbase[0] * meshScaling.getX(),
						graphicsbase[1] * meshScaling.getY(),
						graphicsbase[2] * meshScaling.getZ());
				}
				else
				{
					double* graphicsbase = (double*)(vertexbase + graphicsindex * stride);

					m_triangle[j] = cbtVector3(
						cbtScalar(graphicsbase[0]) * meshScaling.getX(),
						cbtScalar(graphicsbase[1]) * meshScaling.getY(),
						cbtScalar(graphicsbase[2]) * meshScaling.getZ());
				}
#ifdef DEBUG_TRIANGLE_MESH
				printf("triangle vertices:%f,%f,%f\n", triangle[j].x(), triangle[j].y(), triangle[j].z());
#endif  //DEBUG_TRIANGLE_MESH
			}

			m_callback->processTriangle(m_triangle, nodeSubPart, nodeTriangleIndex);
			m_meshInterface->unLockReadOnlyVertexBase(nodeSubPart);
		}
	};

	MyNodeOverlapCallback myNodeCallback(callback, m_meshInterface);

	m_bvh->reportAabbOverlappingNodex(&myNodeCallback, aabbMin, aabbMax);

#endif  //DISABLE_BVH
}